

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LicenseAccess.cpp
# Opt level: O2

ostream * __thiscall
bhf::ads::TcLicenseOnlineInfo::ShowStatus(TcLicenseOnlineInfo *this,ostream *os)

{
  int iVar1;
  const_iterator cVar2;
  ostream *poVar3;
  long lVar4;
  initializer_list<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  allocator_type local_d2;
  less<unsigned_int> local_d1;
  int local_d0 [4];
  pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_70;
  pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  
  if (ShowStatus(std::ostream&)::states_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&ShowStatus(std::ostream&)::states_abi_cxx11_);
    if (iVar1 != 0) {
      local_d0[3] = 0;
      std::
      pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<int,_const_char_(&)[6],_true>(&local_c0,local_d0 + 3,(char (*) [6])"Valid");
      local_d0[2] = 0x203;
      std::
      pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<int,_const_char_(&)[16],_true>(&local_98,local_d0 + 2,(char (*) [16])"Valid (Pending)")
      ;
      local_d0[1] = 0x254;
      std::
      pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<int,_const_char_(&)[14],_true>(&local_70,local_d0 + 1,(char (*) [14])"Valid (Trial)");
      local_d0[0] = 0x255;
      std::
      pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<int,_const_char_(&)[12],_true>(&local_48,local_d0,(char (*) [12])"Valid (OEM)");
      __l._M_len = 4;
      __l._M_array = &local_c0;
      std::
      map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map(&ShowStatus(std::ostream&)::states_abi_cxx11_,__l,&local_d1,&local_d2);
      lVar4 = 0x80;
      do {
        std::__cxx11::string::~string((string *)((long)&local_c0.first + lVar4));
        lVar4 = lVar4 + -0x28;
      } while (lVar4 != -0x20);
      __cxa_atexit(std::
                   map<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~map,&ShowStatus(std::ostream&)::states_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&ShowStatus(std::ostream&)::states_abi_cxx11_);
    }
  }
  cVar2 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&ShowStatus(std::ostream&)::states_abi_cxx11_._M_t,&this->nResult);
  if ((_Rb_tree_header *)cVar2._M_node ==
      &ShowStatus(std::ostream&)::states_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
    poVar3 = std::operator<<(os,"0x");
    *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) =
         *(uint *)(poVar3 + *(long *)(*(long *)poVar3 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  }
  else {
    poVar3 = std::operator<<(os,(string *)&cVar2._M_node[1]._M_parent);
  }
  return poVar3;
}

Assistant:

std::ostream& ShowStatus(std::ostream& os) const
    {
        static const std::map<uint32_t, std::string> states = {
            { 0, "Valid" },
            { 515, "Valid (Pending)" },
            { 596, "Valid (Trial)" },
            { 597, "Valid (OEM)" },
        };
        const auto it = states.find(nResult);
        if (states.end() != it) {
            return os << it->second;
        }
        return os << "0x" << std::hex << nResult;
    }